

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O2

double __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::ReSolve
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this)

{
  pointer psVar1;
  BGIP_BnB_NodePtr *pBVar2;
  char cVar3;
  ostream *poVar4;
  long lVar5;
  Index i;
  uint uVar6;
  double dVar7;
  allocator<char> local_a9;
  BGIP_BnB_NodePtr top;
  BGIP_BnB_NodePtr local_88;
  BGIP_BnB_NodePtr local_78;
  undefined1 *local_60;
  BGIP_BnB_NodePtr local_58;
  BGIP_BnB_NodePtr local_48;
  
  if (0 < this->_m_verbosity) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "BGIP_SolverBranchAndBound starting BG Branch\'n\'Bound search now!");
    std::endl<char,std::char_traits<char>>(poVar4);
    top.px = *(element_type **)
              &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
               super_BGIP_IncrementalSolverInterface.field_0x8;
    top.pn.pi_ = *(sp_counted_base **)
                  &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                   super_BGIP_IncrementalSolverInterface.field_0x10;
    if (top.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (top.pn.pi_)->use_count_ = (top.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    BayesianGameBase::GetNrJointPolicies((BayesianGameBase *)top.px);
    boost::detail::shared_count::~shared_count(&top.pn);
    poVar4 = std::operator<<((ostream *)&std::cout,"BGIP_SolverBranchAndBound Solver Address: ");
    poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
    poVar4 = std::operator<<(poVar4,", nr BG JPols=");
    poVar4 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar4);
    std::operator<<(poVar4,", CBG_LB=");
    poVar4 = std::ostream::_M_insert<double>(this->_m_CBGlowerBound);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  this->_m_maxLowerBound = -1.79769313486232e+308;
  lVar5 = BGIPSolution::GetNrFoundSolutions();
  if (lVar5 != 0) {
    dVar7 = (double)BGIPSolution::GetPayoff();
    this->_m_maxLowerBound = dVar7;
    if (0 < this->_m_verbosity) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "Initialized max lower bound to value of best solution (out of ");
      BGIPSolution::GetNrFoundSolutions();
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::operator<<(poVar4," already found): ");
      poVar4 = std::ostream::_M_insert<double>(this->_m_maxLowerBound);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  i = 0;
  uVar6 = 1;
  local_60 = &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
              super_BGIP_IncrementalSolverInterface.field_0x18;
  do {
    if ((this->_m_openQueue->c).
        super__Vector_base<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->_m_openQueue->c).
        super__Vector_base<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0011510c:
      if (0 < this->_m_verbosity) {
        poVar4 = std::operator<<((ostream *)&std::cout,"BGIP_SolverBranchAndBound Found ");
        BGIPSolution::GetNrFoundSolutions();
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4," solutions, after expanding ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::operator<<(poVar4," nodes (");
        dVar7 = GetPerJPRatio(this,this->_m_nrNodesExpanded);
        poVar4 = std::ostream::_M_insert<double>(dVar7);
        poVar4 = std::operator<<(poVar4," pjp) - of which ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::operator<<(poVar4," full (");
        dVar7 = GetPerJPRatio(this,this->_m_nrNodesFullySpecified);
        poVar4 = std::ostream::_M_insert<double>(dVar7);
        poVar4 = std::operator<<(poVar4," pjp) - and pruning ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4," of those");
        std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<((ostream *)&std::cout,"BGIP_SolverBranchAndBound ");
        poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
        poVar4 = std::operator<<(poVar4," Open Queue size: ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      dVar7 = (double)BGIPSolution::GetPayoff();
      return dVar7;
    }
    PrintStatistics(this,i);
    if ((uVar6 / 100) * 100 - 1 == i) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&top,"BnB deadline exceeded",&local_a9);
      (**(code **)(*(long *)&(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                             super_BGIP_IncrementalSolverInterface + 8))(this,&top);
      std::__cxx11::string::~string((string *)&top);
    }
    psVar1 = (this->_m_openQueue->c).
             super__Vector_base<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    top.px = psVar1->px;
    top.pn.pi_ = (psVar1->pn).pi_;
    if (top.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (top.pn.pi_)->use_count_ = (top.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    if (*(long *)&(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                  super_BGIP_IncrementalSolverInterface.field_0x30 == 1) {
      cVar3 = BGIP_BnB_Node::IsFullySpecifiedPolicy((uint)top.px);
      if ((cVar3 == '\0') ||
         (*(double *)(top.px + 0x10) + *(double *)(top.px + 0x18) <= this->_m_CBGupperBound + -1e-12
         )) goto LAB_00114f9e;
      poVar4 = std::operator<<((ostream *)&std::cout,"Hit CBG upperbound");
      std::endl<char,std::char_traits<char>>(poVar4);
      local_48.px = top.px;
      local_48.pn.pi_ = top.pn.pi_;
      if (top.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (top.pn.pi_)->use_count_ = (top.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      pBVar2 = &local_48;
      ProcessFullySpecifiedNode(this,&local_48);
LAB_001150f3:
      boost::detail::shared_count::~shared_count(&pBVar2->pn);
      this->_m_nrNodesFullySpecified = this->_m_nrNodesFullySpecified + 1;
      boost::detail::shared_count::~shared_count(&top.pn);
      goto LAB_0011510c;
    }
LAB_00114f9e:
    if (*(double *)(top.px + 0x10) + *(double *)(top.px + 0x18) < this->_m_maxLowerBound) {
      cVar3 = BGIP_BnB_Node::IsFullySpecifiedPolicy((uint)top.px);
      if (cVar3 != '\0') {
        local_58.px = top.px;
        local_58.pn.pi_ = top.pn.pi_;
        if (top.pn.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (top.pn.pi_)->use_count_ = (top.pn.pi_)->use_count_ + 1;
          UNLOCK();
        }
        pBVar2 = &local_58;
        ProcessFullySpecifiedNode(this,&local_58);
        goto LAB_001150f3;
      }
    }
    cVar3 = BGIP_BnB_Node::IsFullySpecifiedPolicy((uint)top.px);
    if (cVar3 == '\0') {
      if (3 < this->_m_verbosity) {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "BGIP_SolverBranchAndBound EXPANDING top node ");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      local_88.px = top.px;
      local_88.pn.pi_ = top.pn.pi_;
      if (top.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (top.pn.pi_)->use_count_ = (top.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      ExpandAllExtensions(this,&local_88);
      boost::detail::shared_count::~shared_count(&local_88.pn);
    }
    else {
      local_78.px = top.px;
      local_78.pn.pi_ = top.pn.pi_;
      if (top.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (top.pn.pi_)->use_count_ = (top.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      ProcessFullySpecifiedNode(this,&local_78);
      boost::detail::shared_count::~shared_count(&local_78.pn);
      this->_m_nrNodesFullySpecified = this->_m_nrNodesFullySpecified + 1;
    }
    boost::detail::shared_count::~shared_count(&top.pn);
    uVar6 = uVar6 + 1;
    i = i + 1;
  } while( true );
}

Assistant:

double ReSolve()
    {
        if(_m_verbosity>=1)
        {
            std::cout << "BGIP_SolverBranchAndBound starting BG Branch'n'Bound search now!"<<std::endl;
            LIndex nrJPols=0;
            try{
                nrJPols = this->GetBGIPI()->GetNrJointPolicies();
            } catch(E& e)
            { ; }
            std::cout << "BGIP_SolverBranchAndBound Solver Address: "
                      << this << ", nr BG JPols=" << nrJPols
                      << ", CBG_LB=" << _m_CBGlowerBound << std::endl;
        }

        _m_maxLowerBound=-DBL_MAX;
#if INITIALIZE_LB_TO_BESTFOUND
        if(this->GetNrFoundSolutions()>0)
        {
            _m_maxLowerBound=this->GetPayoff();
            if(_m_verbosity>=1)
                std::cout << "Initialized max lower bound to value of best solution (out of "
                          << this->GetNrFoundSolutions() << " already found): "
                          << _m_maxLowerBound << std::endl;
        }
#endif

        Index i=0;
        // keep on expanding the open queue until it's empty
        while(!_m_openQueue->empty())
        {
            PrintStatistics(i++);

            if(i % 100 == 0)
                this->CheckDeadline("BnB deadline exceeded");

            BGIP_BnB_NodePtr top=_m_openQueue->top();
            

            if(this->GetNrDesiredSolutions()==1 &&
               top->IsFullySpecifiedPolicy(_m_maxDepth) &&
               top->GetF() > (_m_CBGupperBound-PROB_PRECISION))
            {
                std::cout << "Hit CBG upperbound" << std::endl;
                ProcessFullySpecifiedNode(top);
                _m_nrNodesFullySpecified++;
                break;
            }
#if BAILOUT_WHEN_CBG_LOWERBOUND_IS_HIT
            if(top->GetF() < _m_CBGlowerBound)
            {
                std::cout << "Hit CBG lowerbound, bailing out" << std::endl;
                return(-DBL_MAX);
            }
#endif
            if(top->GetF() < _m_maxLowerBound &&
               top->IsFullySpecifiedPolicy(_m_maxDepth)) // we still need to check
                                              // whether this is a fully
                                              // specified policy, there
                                              // can be multiple nodes
                                              // with the same
                                              // heuristic<LB, but not all
                                              // need to be complete
            {
                //We are done!!!
                //(max. upper bound < best found policy)
                
                //put the best policy on the solution
    //             ConvertNodeToPolicyAndAddToSolution(top, _m_maxLowerBound);
    //             PopAndDeleteNode(top);
                ProcessFullySpecifiedNode(top);
                _m_nrNodesFullySpecified++;
                //not really needed:
                //Prune(_m_maxLowerBound);
                break;
            }

            //for evaluation of the final policy, the expansion of nodes
            //and the computation of heuristic values  for the children we
            //will need to check whether actions are consistent. 
#if CACHE_IMPLIED_JPOL
            //(We cache the already specified actions in _m_impliedJPol)
            InitImpliedJPol();
#if DEBUG_VALID_ACTIONS 
            std::cout << "BGIP_SolverBranchAndBound implied jpol after initialization: " << 
                SoftPrintVector(_m_impliedJPol) << std::endl;
#endif                        
            top->GetImpliedJPol(_m_bgip, _m_jtIndexMapping, _m_impliedJPol);
#if DEBUG_VALID_ACTIONS 
            std::cout << "BGIP_SolverBranchAndBound implied jpol after GetImpliedJPol: " << 
                SoftPrintVector(_m_impliedJPol) << std::endl;
#endif                        
#endif // CACHE_IMPLIED_JPOL

            //else (if ! top->GetF() < _m_maxLowerBound )
            // check if node is fully specified
            if(top->IsFullySpecifiedPolicy(_m_maxDepth))
            {
                // updates _m_maxLowerBound and deletes the node
                ProcessFullySpecifiedNode(top);
                _m_nrNodesFullySpecified++;
            }
            else
            {
                if(_m_verbosity>3)
                    std::cout << "BGIP_SolverBranchAndBound EXPANDING top node "
                              <<std::endl;
                //top will be expanded
                //
#if INCR_EXPAND
                if(_m_expandAll)
                    ExpandAllExtensions(top);
                else
                    ExpandOneExtension(top);
#else                    
                ExpandAllExtensions(top);
#endif
            }
        }

        if(_m_verbosity>=1)
        {
            std::cout << "BGIP_SolverBranchAndBound Found "
                      << (this->
                          GetNrFoundSolutions())
                      << " solutions, after expanding "
                      << _m_nrNodesExpanded << " nodes ("
                      << GetPerJPRatio(_m_nrNodesExpanded) <<" pjp) - of which "
                      << _m_nrNodesFullySpecified << " full ("
                      << GetPerJPRatio(_m_nrNodesFullySpecified)
                      << " pjp) - and pruning "
                      << _m_nrNodesPruned << " of those"
                      << std::endl;
            std::cout << "BGIP_SolverBranchAndBound " << this
                      << " Open Queue size: " << _m_openQueue->size() << std::endl;
        }

        return(this->
               GetPayoff());
    }